

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

void uv__signal_handler(int signum)

{
  int iVar1;
  uv_signal_s *puVar2;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  uv_signal_t *puVar6;
  ssize_t sVar7;
  uv_signal_s *puVar8;
  bool bVar9;
  uv_signal_t *local_38;
  undefined8 local_30;
  
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  local_30 = 0;
  iVar4 = uv__signal_lock();
  if (iVar4 == 0) {
    puVar6 = uv__signal_first_handle(signum);
    if (puVar6 != (uv_signal_t *)0x0) {
      iVar4 = puVar6->signum;
      while (iVar4 == signum) {
        uVar3 = (ulong)local_30 >> 0x20;
        local_30 = CONCAT44((int)uVar3,signum);
        local_38 = puVar6;
        do {
          sVar7 = write(puVar6->loop->signal_pipefd[1],&local_38,0x10);
          if ((int)sVar7 != -1) {
            if ((int)sVar7 != 0x10) goto LAB_00549abb;
            puVar6->caught_signals = puVar6->caught_signals + 1;
            goto LAB_00549a5e;
          }
        } while (*piVar5 == 4);
        if (*piVar5 != 0xb) {
LAB_00549abb:
          __assert_fail("r == sizeof msg || (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/signal.c"
                        ,199,"void uv__signal_handler(int)");
        }
LAB_00549a5e:
        puVar2 = (puVar6->tree_entry).rbe_right;
        if (puVar2 == (uv_signal_s *)0x0) {
          puVar8 = (puVar6->tree_entry).rbe_parent;
          if ((puVar8 == (uv_signal_s *)0x0) || ((puVar8->tree_entry).rbe_left != puVar6)) {
            do {
              puVar8 = (puVar6->tree_entry).rbe_parent;
              if (puVar8 == (uv_signal_s *)0x0) goto LAB_00549aa6;
              bVar9 = puVar6 == (puVar8->tree_entry).rbe_right;
              puVar6 = puVar8;
            } while (bVar9);
          }
        }
        else {
          do {
            puVar8 = puVar2;
            puVar2 = (puVar8->tree_entry).rbe_left;
          } while (puVar2 != (uv_signal_s *)0x0);
        }
        puVar6 = puVar8;
        iVar4 = puVar8->signum;
      }
    }
LAB_00549aa6:
    uv__signal_unlock();
  }
  *piVar5 = iVar1;
  return;
}

Assistant:

static void uv__signal_handler(int signum) {
  uv__signal_msg_t msg;
  uv_signal_t* handle;
  int saved_errno;

  saved_errno = errno;
  memset(&msg, 0, sizeof msg);

  if (uv__signal_lock()) {
    errno = saved_errno;
    return;
  }

  for (handle = uv__signal_first_handle(signum);
       handle != NULL && handle->signum == signum;
       handle = RB_NEXT(uv__signal_tree_s, &uv__signal_tree, handle)) {
    int r;

    msg.signum = signum;
    msg.handle = handle;

    /* write() should be atomic for small data chunks, so the entire message
     * should be written at once. In theory the pipe could become full, in
     * which case the user is out of luck.
     */
    do {
      r = write(handle->loop->signal_pipefd[1], &msg, sizeof msg);
    } while (r == -1 && errno == EINTR);

    assert(r == sizeof msg ||
           (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK)));

    if (r != -1)
      handle->caught_signals++;
  }

  uv__signal_unlock();
  errno = saved_errno;
}